

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O3

int mbedtls_des_key_check_weak(uchar *key)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(long *)(weak_key_table[0] + lVar1) == *(long *)key) {
      return 1;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x80);
  return 0;
}

Assistant:

int mbedtls_des_key_check_weak( const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;

    for( i = 0; i < WEAK_KEY_COUNT; i++ )
        if( memcmp( weak_key_table[i], key, MBEDTLS_DES_KEY_SIZE) == 0 )
            return( 1 );

    return( 0 );
}